

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetCodeGenerator.cc
# Opt level: O0

void __thiscall flow::TargetCodeGenerator::visit(TargetCodeGenerator *this,SCmpREInstr *scmpre)

{
  FILE *__stream;
  Value *pVVar1;
  undefined8 uVar2;
  size_t sVar3;
  ConstantValue<flow::util::RegExp,_(flow::LiteralType)7> *local_b0;
  RegExp local_98;
  allocator<char> local_41;
  string local_40 [32];
  ConstantValue<flow::util::RegExp,_(flow::LiteralType)7> *local_20;
  ConstantRegExp *re;
  SCmpREInstr *scmpre_local;
  TargetCodeGenerator *this_local;
  
  re = (ConstantRegExp *)scmpre;
  scmpre_local = (SCmpREInstr *)this;
  pVVar1 = Instr::operand(&scmpre->super_Instr,1);
  if (pVVar1 == (Value *)0x0) {
    local_b0 = (ConstantValue<flow::util::RegExp,_(flow::LiteralType)7> *)0x0;
  }
  else {
    local_b0 = (ConstantValue<flow::util::RegExp,_(flow::LiteralType)7> *)
               __dynamic_cast(pVVar1,&Value::typeinfo,
                              &ConstantValue<flow::util::RegExp,(flow::LiteralType)7>::typeinfo,0);
  }
  __stream = _stderr;
  local_20 = local_b0;
  if (local_b0 == (ConstantValue<flow::util::RegExp,_(flow::LiteralType)7> *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_40,"flow: RHS must be a ConstantRegExp",&local_41);
    uVar2 = std::__cxx11::string::c_str();
    fprintf(__stream,"%s\n",uVar2);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator(&local_41);
    abort();
  }
  pVVar1 = Instr::operand((Instr *)re,0);
  emitLoad(this,pVVar1);
  ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>::get(&local_98,local_20);
  sVar3 = ConstantPool::makeRegExp(&this->cp_,&local_98);
  emitInstr(this,SREGMATCH,(Operand)sVar3);
  util::RegExp::~RegExp(&local_98);
  changeStack(this,1,(Value *)re);
  return;
}

Assistant:

void TargetCodeGenerator::visit(SCmpREInstr& scmpre) {
  auto re = dynamic_cast<ConstantRegExp*>(scmpre.operand(1));
  FLOW_ASSERT(re != nullptr, "flow: RHS must be a ConstantRegExp");

  emitLoad(scmpre.operand(0));
  emitInstr(Opcode::SREGMATCH, cp_.makeRegExp(re->get()));
  changeStack(1, &scmpre);
}